

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O1

uint8_t * WebPDecodeYUV(uint8_t *data,size_t data_size,int *width,int *height,uint8_t **u,
                       uint8_t **v,int *stride,int *uv_stride)

{
  undefined4 in_EAX;
  int iVar1;
  uint8_t *puVar2;
  undefined1 auVar3 [16];
  WebPDecBuffer WStack_88;
  
  auVar3._0_4_ = -(uint)(u == (uint8_t **)0x0);
  auVar3._4_4_ = -(uint)(v == (uint8_t **)0x0);
  auVar3._8_4_ = -(uint)(stride == (int *)0x0);
  auVar3._12_4_ = -(uint)(uv_stride == (int *)0x0);
  iVar1 = movmskps(in_EAX,auVar3);
  if (iVar1 == 0) {
    puVar2 = Decode(MODE_YUV,data,data_size,width,height,&WStack_88);
    if (puVar2 != (uint8_t *)0x0) {
      *u = WStack_88.u.YUVA.u;
      *v = (uint8_t *)WStack_88.u.RGBA.size;
      *stride = WStack_88.u.YUVA.y_stride;
      *uv_stride = WStack_88.u.YUVA.u_stride;
    }
  }
  else {
    puVar2 = (uint8_t *)0x0;
  }
  return puVar2;
}

Assistant:

uint8_t* WebPDecodeYUV(const uint8_t* data, size_t data_size,
                       int* width, int* height, uint8_t** u, uint8_t** v,
                       int* stride, int* uv_stride) {
  // data, width and height are checked by Decode().
  if (u == NULL || v == NULL || stride == NULL || uv_stride == NULL) {
    return NULL;
  }

  {
    WebPDecBuffer output;   // only to preserve the side-infos
    uint8_t* const out = Decode(MODE_YUV, data, data_size,
                                width, height, &output);

    if (out != NULL) {
      const WebPYUVABuffer* const buf = &output.u.YUVA;
      *u = buf->u;
      *v = buf->v;
      *stride = buf->y_stride;
      *uv_stride = buf->u_stride;
      assert(buf->u_stride == buf->v_stride);
    }
    return out;
  }
}